

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O2

void __thiscall ast::Dir_section::Dir_section(Dir_section *this,string name,Location left)

{
  long lVar1;
  string *in_RSI;
  string sStack_38;
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  (this->super_Directive).super_Statement.location.unit = name._M_dataplus._M_p;
  (this->super_Directive).super_Statement.location.line = (undefined4)name._M_string_length;
  (this->super_Directive).super_Statement.location.first_column = name._M_string_length._4_4_;
  *(size_type *)&(this->super_Directive).super_Statement.location.last_column =
       name.field_2._M_allocated_capacity;
  (this->super_Directive).super_Statement.section_index = 0;
  (this->super_Directive).super_Statement.section_offset = 0;
  (this->super_Directive).super_Statement.size_in_memory = 0;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_section_0013b800
  ;
  std::__cxx11::string::string((string *)&this->name,in_RSI);
  std::__cxx11::string::string((string *)&sStack_38,in_RSI);
  Sections::set_section(&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  lVar1 = Sections::current_section;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar1 + 0x30);
  (this->super_Directive).super_Statement.size_in_memory = 0;
  return;
}

Assistant:

Dir_section::Dir_section(string name, Location left) :
	Directive {left}, name {name}
{
	Sections::set_section(name);
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = 0;
}